

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  iterator iVar1;
  pointer *__ptr;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  unknown_flag;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> local_40;
  char flag_local;
  padding_info padding_local;
  _Head_base<0UL,_spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_*,_false>
  local_20;
  
  padding_local.width_._0_6_ = (undefined6)padding.width_;
  padding_local.width_._6_2_ = padding.width_._6_2_;
  padding_local.side_ = padding.side_;
  padding_local.truncate_ = padding.truncate_;
  padding_local.enabled_ = padding.enabled_;
  padding_local._14_2_ = padding._14_2_;
  flag_local = flag;
  iVar1 = std::
          _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->custom_handlers_)._M_h,&flag_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)(**(long **)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                                   ._M_cur + 0x10) + 0x18))(&unknown_flag);
    local_40._M_head_impl = (aggregate_formatter *)unknown_flag;
    *(ulong *)((long)unknown_flag._M_t.
                     super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                     _M_head_impl + 0xe) =
         CONCAT17(padding_local.enabled_,
                  CONCAT16(padding_local.truncate_,
                           CONCAT42(padding_local.side_,padding_local.width_._6_2_)));
    *(ulong *)((long)unknown_flag._M_t.
                     super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                     _M_head_impl + 8) =
         CONCAT26(padding_local.width_._6_2_,(undefined6)padding_local.width_);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_40);
    if ((_Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )local_40._M_head_impl != (aggregate_formatter *)0x0) {
      (*((local_40._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
    }
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      return;
    }
    (**(code **)(*(long *)unknown_flag._M_t.
                          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                          _M_head_impl + 8))();
    return;
  }
  switch(flag_local) {
  case '!':
    details::
    make_unique<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  default:
    details::make_unique<spdlog::details::aggregate_formatter>();
    if (padding_local.truncate_ == false) {
      std::__cxx11::string::push_back
                ((char)unknown_flag._M_t.
                       super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                       _M_head_impl + '\x18');
      std::__cxx11::string::push_back
                ((char)unknown_flag._M_t.
                       super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                       _M_head_impl + '\x18');
      local_40._M_head_impl = (aggregate_formatter *)unknown_flag;
      unknown_flag._M_t.
      super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
      .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
           (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
              )0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_40);
    }
    else {
      padding_local.truncate_ = false;
      details::
      make_unique<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
                ((details *)&local_20,&padding_local);
      local_40._M_head_impl = (aggregate_formatter *)local_20._M_head_impl;
      local_20._M_head_impl = (source_funcname_formatter<spdlog::details::scoped_padder> *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_40);
      if (local_40._M_head_impl != (aggregate_formatter *)0x0) {
        (*((local_40._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
      }
      local_40._M_head_impl = (aggregate_formatter *)0x0;
      std::
      unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
      ::~unique_ptr((unique_ptr<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>_>_>
                     *)&local_20);
      std::__cxx11::string::push_back
                ((char)unknown_flag._M_t.
                       super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                       _M_head_impl + '\x18');
      local_40._M_head_impl = (aggregate_formatter *)unknown_flag;
      unknown_flag._M_t.
      super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
      .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
           (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
              )0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_40);
    }
    if (local_40._M_head_impl != (aggregate_formatter *)0x0) {
      (*((local_40._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
    }
    std::
    unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ::~unique_ptr(&unknown_flag);
    break;
  case '#':
    details::
    make_unique<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case '$':
    details::make_unique<spdlog::details::color_stop_formatter,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                   *)&local_40);
    break;
  case '%':
    local_20._M_head_impl._0_1_ = 0x25;
    details::make_unique<spdlog::details::ch_formatter,char>((details *)&local_40,(char *)&local_20)
    ;
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
                 *)&local_40);
    break;
  case '+':
    details::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                   *)&local_40);
    goto LAB_0012e184;
  case '@':
    details::
    make_unique<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_location_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'A':
    details::
    make_unique<spdlog::details::A_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    if (local_40._M_head_impl != (aggregate_formatter *)0x0) {
      (*((local_40._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
    }
    goto LAB_0012e184;
  case 'B':
    details::
    make_unique<spdlog::details::B_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::B_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::B_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'C':
    details::
    make_unique<spdlog::details::C_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::C_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::C_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'D':
  case 'x':
    details::
    make_unique<spdlog::details::D_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::D_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::D_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'E':
    details::
    make_unique<spdlog::details::E_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::E_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::E_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'F':
    details::
    make_unique<spdlog::details::F_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::F_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::F_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'H':
    details::
    make_unique<spdlog::details::H_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::H_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::H_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'I':
    details::
    make_unique<spdlog::details::I_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::I_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::I_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'L':
    details::
    make_unique<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_level_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'M':
    details::
    make_unique<spdlog::details::M_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::M_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::M_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'O':
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                   *)&local_40);
    break;
  case 'P':
    details::
    make_unique<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::pid_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::pid_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'R':
    details::
    make_unique<spdlog::details::R_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::R_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::R_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'S':
    details::
    make_unique<spdlog::details::S_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::S_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::S_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'T':
  case 'X':
    details::
    make_unique<spdlog::details::T_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::T_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::T_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'Y':
    details::
    make_unique<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::Y_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::Y_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case '^':
    details::make_unique<spdlog::details::color_start_formatter,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                   *)&local_40);
    break;
  case 'a':
    details::
    make_unique<spdlog::details::a_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::a_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::a_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'b':
  case 'h':
    details::
    make_unique<spdlog::details::b_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::b_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::b_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'c':
    details::
    make_unique<spdlog::details::c_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::c_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::c_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'd':
    details::
    make_unique<spdlog::details::d_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::d_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::d_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'e':
    details::
    make_unique<spdlog::details::e_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::e_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::e_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'f':
    details::
    make_unique<spdlog::details::f_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::f_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::f_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'g':
    details::
    make_unique<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'i':
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>_>
                   *)&local_40);
    break;
  case 'l':
    details::
    make_unique<spdlog::details::level_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::level_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::level_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'm':
    details::
    make_unique<spdlog::details::m_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::m_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::m_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'n':
    details::
    make_unique<spdlog::details::name_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::name_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::name_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'o':
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>_>
                   *)&local_40);
    break;
  case 'p':
    details::
    make_unique<spdlog::details::p_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::p_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::p_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 'r':
    details::
    make_unique<spdlog::details::r_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::r_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::r_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    goto LAB_0012e184;
  case 's':
    details::
    make_unique<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 't':
    details::
    make_unique<spdlog::details::t_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::t_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::t_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'u':
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::default_delete<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                   *)&local_40);
    break;
  case 'v':
    details::
    make_unique<spdlog::details::v_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::v_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::v_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
    break;
  case 'z':
    details::
    make_unique<spdlog::details::z_formatter<spdlog::details::scoped_padder>,spdlog::details::padding_info&>
              ((details *)&local_40,&padding_local);
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
            )local_40._M_head_impl;
    local_40._M_head_impl = (aggregate_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&unknown_flag);
    if ((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )unknown_flag._M_t.
          super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ._M_t.
          super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
          .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
         )0x0) {
      (**(code **)(*(long *)unknown_flag._M_t.
                            super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
                            .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>.
                            _M_head_impl + 8))();
    }
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl =
         (__uniq_ptr_data<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>,_true,_true>
          )(__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
            )0x0;
    std::
    unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>_>_>
    ::~unique_ptr((unique_ptr<spdlog::details::z_formatter<spdlog::details::scoped_padder>,_std::default_delete<spdlog::details::z_formatter<spdlog::details::scoped_padder>_>_>
                   *)&local_40);
LAB_0012e184:
    this->need_localtime_ = true;
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding)
{
    // process custom flags
    auto it = custom_handlers_.find(flag);
    if (it != custom_handlers_.end())
    {
        auto custom_handler = it->second->clone();
        custom_handler->set_padding_info(padding);
        formatters_.push_back(std::move(custom_handler));
        return;
    }

    // process built-in flags
    switch (flag)
    {
    case ('+'): // default formatter
        formatters_.push_back(details::make_unique<details::full_formatter>(padding));
        need_localtime_ = true;
        break;

    case 'n': // logger name
        formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
        break;

    case 'l': // level
        formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
        break;

    case 'L': // short level
        formatters_.push_back(details::make_unique<details::short_level_formatter<Padder>>(padding));
        break;

    case ('t'): // thread id
        formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
        break;

    case ('v'): // the message text
        formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
        break;

    case ('a'): // weekday
        formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('A'): // short weekday
        formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('b'):
    case ('h'): // month
        formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('B'): // short month
        formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('c'): // datetime
        formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('C'): // year 2 digits
        formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('Y'): // year 4 digits
        formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('D'):
    case ('x'): // datetime MM/DD/YY
        formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('m'): // month 1-12
        formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('d'): // day of month 1-31
        formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('H'): // hours 24
        formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('I'): // hours 12
        formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('M'): // minutes
        formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('S'): // seconds
        formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('e'): // milliseconds
        formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
        break;

    case ('f'): // microseconds
        formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
        break;

    case ('F'): // nanoseconds
        formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
        break;

    case ('E'): // seconds since epoch
        formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
        break;

    case ('p'): // am/pm
        formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('r'): // 12 hour clock 02:55:02 pm
        formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('R'): // 24-hour HH:MM time
        formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('T'):
    case ('X'): // ISO 8601 time format (HH:MM:SS)
        formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('z'): // timezone
        formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
        need_localtime_ = true;
        break;

    case ('P'): // pid
        formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
        break;

    case ('^'): // color range start
        formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
        break;

    case ('$'): // color range end
        formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
        break;

    case ('@'): // source location (filename:filenumber)
        formatters_.push_back(details::make_unique<details::source_location_formatter<Padder>>(padding));
        break;

    case ('s'): // short source filename - without directory name
        formatters_.push_back(details::make_unique<details::short_filename_formatter<Padder>>(padding));
        break;

    case ('g'): // full source filename
        formatters_.push_back(details::make_unique<details::source_filename_formatter<Padder>>(padding));
        break;

    case ('#'): // source line number
        formatters_.push_back(details::make_unique<details::source_linenum_formatter<Padder>>(padding));
        break;

    case ('!'): // source funcname
        formatters_.push_back(details::make_unique<details::source_funcname_formatter<Padder>>(padding));
        break;

    case ('%'): // % char
        formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
        break;

    case ('u'): // elapsed time since last log message in nanos
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(padding));
        break;

    case ('i'): // elapsed time since last log message in micros
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(padding));
        break;

    case ('o'): // elapsed time since last log message in millis
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(padding));
        break;

    case ('O'): // elapsed time since last log message in seconds
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(padding));
        break;

    default: // Unknown flag appears as is
        auto unknown_flag = details::make_unique<details::aggregate_formatter>();

        if (!padding.truncate_)
        {
            unknown_flag->add_ch('%');
            unknown_flag->add_ch(flag);
            formatters_.push_back((std::move(unknown_flag)));
        }
        // fix issue #1617 (prev char was '!' and should have been treated as funcname flag instead of truncating flag)
        // spdlog::set_pattern("[%10!] %v") => "[      main] some message"
        // spdlog::set_pattern("[%3!!] %v") => "[mai] some message"
        else
        {
            padding.truncate_ = false;
            formatters_.push_back(details::make_unique<details::source_funcname_formatter<Padder>>(padding));
            unknown_flag->add_ch(flag);
            formatters_.push_back((std::move(unknown_flag)));
        }

        break;
    }
}